

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_in_out_testing_v2.cpp
# Opt level: O0

int execute_tests(string *out_name,string *exp_name)

{
  bool bVar1;
  ulong uVar2;
  istream *piVar3;
  ostream *poVar4;
  char *__rhs;
  string local_770;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_750;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_730;
  string local_710;
  string local_6f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_650;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  string local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  allocator local_5a9;
  string local_5a8;
  allocator local_581;
  string local_580;
  allocator local_559;
  string local_558;
  string local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  undefined1 local_4d8 [8];
  string exp_line;
  string out_line;
  int local_490;
  int error_count;
  int line_nr;
  ifstream local_468 [8];
  ifstream exp_no_comment_file;
  ifstream local_250 [8];
  ifstream out_file;
  undefined1 local_40 [8];
  string exp_no_comment_name;
  string *exp_name_local;
  string *out_name_local;
  
  exp_no_comment_name.field_2._8_8_ = exp_name;
  create_file_with_removed_comments((string *)local_40,exp_name);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::ifstream::ifstream(local_250,out_name,8);
    std::ifstream::ifstream(local_468,local_40,8);
    bVar1 = problem_with_file_to_read(local_250,out_name);
    if (bVar1) {
      out_name_local._4_4_ = -9999;
    }
    else {
      bVar1 = problem_with_file_to_read(local_468,(string *)local_40);
      if (bVar1) {
        out_name_local._4_4_ = -9999;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&line_nr,"executing tests...\n",(allocator *)((long)&error_count + 3));
        write_colored_text((string *)&line_nr,blue);
        std::__cxx11::string::~string((string *)&line_nr);
        std::allocator<char>::~allocator((allocator<char> *)((long)&error_count + 3));
        local_490 = 0;
        out_line.field_2._12_4_ = 0;
        std::__cxx11::string::string((string *)(exp_line.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)local_4d8);
        while( true ) {
          piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)local_250,(string *)(exp_line.field_2._M_local_buf + 8));
          bVar1 = std::ios::operator_cast_to_bool
                            ((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
          if (!bVar1) break;
          piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)local_468,(string *)local_4d8);
          bVar1 = std::ios::operator_cast_to_bool
                            ((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
          if (bVar1) {
            local_490 = local_490 + 1;
            bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&exp_line.field_2 + 8),
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_4d8);
            if (bVar1) {
              std::__cxx11::to_string(&local_538,local_490);
              std::operator+(&local_518,"Error: Line ",&local_538);
              std::operator+(&local_4f8,&local_518,":\t");
              write_colored_text(&local_4f8,red);
              std::__cxx11::string::~string((string *)&local_4f8);
              std::__cxx11::string::~string((string *)&local_518);
              std::__cxx11::string::~string((string *)&local_538);
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_558,"Expected: ",&local_559);
              write_colored_text(&local_558,yellow);
              std::__cxx11::string::~string((string *)&local_558);
              std::allocator<char>::~allocator((allocator<char> *)&local_559);
              poVar4 = std::operator<<((ostream *)&std::cout,(string *)local_4d8);
              std::operator<<(poVar4,"\t");
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_580,"Your output: ",&local_581);
              write_colored_text(&local_580,cyan);
              std::__cxx11::string::~string((string *)&local_580);
              std::allocator<char>::~allocator((allocator<char> *)&local_581);
              poVar4 = std::operator<<((ostream *)&std::cout,
                                       (string *)(exp_line.field_2._M_local_buf + 8));
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              out_line.field_2._12_4_ = out_line.field_2._12_4_ + 1;
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_5a8,"You produced at least one line to much of output: ",
                       &local_5a9);
            write_colored_text(&local_5a8,red);
            std::__cxx11::string::~string((string *)&local_5a8);
            std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
            poVar4 = std::operator<<((ostream *)&std::cout,
                                     (string *)(exp_line.field_2._M_local_buf + 8));
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            out_line.field_2._12_4_ = out_line.field_2._12_4_ + 1;
          }
        }
        while( true ) {
          piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)local_468,(string *)local_4d8);
          bVar1 = std::ios::operator_cast_to_bool
                            ((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
          if (!bVar1) break;
          local_490 = local_490 + 1;
          std::__cxx11::to_string(&local_610,local_490);
          std::operator+(&local_5f0,"You failed to produce expected line ",&local_610);
          std::operator+(&local_5d0,&local_5f0,":  ");
          write_colored_text(&local_5d0,red);
          std::__cxx11::string::~string((string *)&local_5d0);
          std::__cxx11::string::~string((string *)&local_5f0);
          std::__cxx11::string::~string((string *)&local_610);
          poVar4 = std::operator<<((ostream *)&std::cout,(string *)local_4d8);
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          out_line.field_2._12_4_ = out_line.field_2._12_4_ + 1;
        }
        if ((int)out_line.field_2._12_4_ < 1) {
          std::__cxx11::to_string(&local_770,local_490);
          std::operator+(&local_750,"Yes, no errors, all ",&local_770);
          std::operator+(&local_730,&local_750," lines of output are correct!\n");
          write_colored_text(&local_730,green);
          std::__cxx11::string::~string((string *)&local_730);
          std::__cxx11::string::~string((string *)&local_750);
          std::__cxx11::string::~string((string *)&local_770);
        }
        else {
          std::__cxx11::to_string(&local_6f0,out_line.field_2._12_4_);
          std::operator+(&local_6d0,"You produced ",&local_6f0);
          std::operator+(&local_6b0,&local_6d0," wrong line");
          __rhs = "s";
          if (out_line.field_2._12_4_ == 1) {
            __rhs = "";
          }
          std::operator+(&local_690,&local_6b0,__rhs);
          std::operator+(&local_670,&local_690," of totally ");
          std::__cxx11::to_string(&local_710,local_490);
          std::operator+(&local_650,&local_670,&local_710);
          std::operator+(&local_630,&local_650," lines of expected output!\n");
          write_colored_text(&local_630,magenta);
          std::__cxx11::string::~string((string *)&local_630);
          std::__cxx11::string::~string((string *)&local_650);
          std::__cxx11::string::~string((string *)&local_710);
          std::__cxx11::string::~string((string *)&local_670);
          std::__cxx11::string::~string((string *)&local_690);
          std::__cxx11::string::~string((string *)&local_6b0);
          std::__cxx11::string::~string((string *)&local_6d0);
          std::__cxx11::string::~string((string *)&local_6f0);
        }
        std::ifstream::close();
        remove_a_file((string *)local_40);
        std::ifstream::close();
        std::ifstream::close();
        out_name_local._4_4_ = out_line.field_2._12_4_;
        std::__cxx11::string::~string((string *)local_4d8);
        std::__cxx11::string::~string((string *)(exp_line.field_2._M_local_buf + 8));
      }
    }
    std::ifstream::~ifstream(local_468);
    std::ifstream::~ifstream(local_250);
  }
  else {
    out_name_local._4_4_ = -9999;
  }
  std::__cxx11::string::~string((string *)local_40);
  return out_name_local._4_4_;
}

Assistant:

int execute_tests(const string &out_name, const string &exp_name) {
    // Open 'out_name' and 'exp_name' for 'r'-access:
    // see https://www.tutorialspoint.com/cplusplus/cpp_files_streams.htm
    // ifstream ... : represents input file stream (for reading from files)
    // ofstream ... : represents output file stream (for creating and writing to files)
    // For comparing, you only need reading:


    // Creating file with removed comments in exp_file:
    string exp_no_comment_name = create_file_with_removed_comments(exp_name);
    if (exp_no_comment_name.empty()) return -9999;


    // Open files for read-access
    ifstream out_file(out_name);
    ifstream exp_no_comment_file(exp_no_comment_name);
    if (problem_with_file_to_read(out_file, out_name)) return -9999;
    if (problem_with_file_to_read(exp_no_comment_file, exp_no_comment_name)) return -9999;


    // Run actual tests: do string-comparison line by line
    write_colored_text("executing tests...\n", blue);
    int line_nr = 0, error_count = 0;
    string out_line, exp_line;

    while (getline(out_file, out_line)) {
        if (getline(exp_no_comment_file, exp_line)) {
            line_nr++;
            /*
             * NOTE: I wanted to compare the two string as described in
             * various online resources, such as https://www.geeksforgeeks.org/stdstringcompare-in-c/
             * With:
             *      if (out_line.compare(exp_line) == 0)
             * But CLion showed "Clang-Tidy: Do not use 'compare' to test equality of strings; use the string
             *      equality operator instead"
             *
             * It seems the above construct would be great to see if a string is shorter or longer than the other:
             *      int difference = out_line.compare(exp_line);
             *
             * But here, I only want to know if they are the same.
             * -> after automatic refactoring
             */
            if (out_line != exp_line) {
                write_colored_text("Error: Line " + to_string(line_nr) + ":\t");
                write_colored_text("Expected: ", yellow);
                cout << exp_line << "\t";
                write_colored_text("Your output: ", cyan);
                cout << out_line << endl;
                error_count++;
            }
        } else {
            write_colored_text("You produced at least one line to much of output: ");
            cout << out_line << endl;
            error_count++;
        }
    }

    // Check, if 'expected' has more lines than 'out':
    while (getline(exp_no_comment_file, exp_line)) {
        line_nr++;
        write_colored_text("You failed to produce expected line " + to_string(line_nr) + ":  ");
        cout << exp_line << endl;
        error_count++;
    }

    if (error_count > 0) {
        write_colored_text(
                "You produced " + to_string(error_count) + " wrong line" + (error_count == 1 ? "" : "s") +
                " of totally " + to_string(line_nr) + " lines of expected output!\n",
                magenta);
    } else {
        write_colored_text("Yes, no errors, all " + to_string(line_nr) + " lines of output are correct!\n",
                           green);
    }

    // Remove the file without comments
    exp_no_comment_file.close();
    remove_a_file(exp_no_comment_name);

    out_file.close();
    exp_no_comment_file.close();

    return error_count;
}